

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O3

void __thiscall
flatbuffers::python::anon_unknown_0::PythonStubGenerator::GenerateStructStub
          (PythonStubGenerator *this,stringstream *stub,StructDef *struct_def,Imports *imports)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BaseType BVar3;
  pointer ppFVar4;
  FieldDef *pFVar5;
  pointer pcVar6;
  pointer ppEVar7;
  EnumVal *pEVar8;
  StructDef *pSVar9;
  Parser *pPVar10;
  undefined8 *puVar11;
  ostream *poVar12;
  Import *pIVar13;
  long *plVar14;
  StructDef *pSVar15;
  undefined8 *puVar16;
  _Base_ptr p_Var17;
  long *plVar18;
  _Alloc_hider *p_Var19;
  long lVar20;
  ostream *poVar21;
  char *pcVar22;
  undefined8 uVar23;
  EnumDef *pEVar24;
  EnumDef *pEVar25;
  undefined8 uVar26;
  pointer ppFVar27;
  pointer ppEVar28;
  string *arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  string field_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string type;
  string name_1;
  string local_1c0;
  PythonStubGenerator *local_1a0;
  ostream *local_198;
  undefined1 local_190 [24];
  uint16_t local_178;
  undefined6 uStack_176;
  string local_170;
  long *local_150 [2];
  long local_140 [2];
  IdlNamer *local_130;
  Imports *local_128;
  long *local_120;
  long local_118;
  long local_110;
  undefined8 uStack_108;
  StructDef *local_100;
  long *local_f8;
  long local_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  pointer local_88;
  pointer local_80 [2];
  _Base_ptr *local_70;
  long local_68;
  _Base_ptr local_60 [2];
  _Base_ptr local_50;
  size_t local_48;
  EnumDef *local_40;
  _Base_ptr p_Stack_38;
  
  local_130 = &this->namer_;
  local_1a0 = this;
  local_128 = imports;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(local_98._M_local_buf + 8);
  poVar21 = (ostream *)(stub + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar21,"class ",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar21,(char *)local_98._8_8_,(long)local_88);
  if ((local_1a0->version_).major != 3) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,"(object)",8);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar21,":\n",2);
  if (struct_def->fixed == true) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,"  @classmethod\n",0xf);
    lVar20 = 0x1f;
    pcVar22 = "  def SizeOf(cls) -> int: ...\n\n";
    poVar12 = poVar21;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,"  @classmethod\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar21,"  def GetRootAs(cls, buf: bytes, offset: int) -> ",0x31);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar21,(char *)local_98._8_8_,(long)local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ...\n",6);
    pPVar10 = local_1a0->parser_;
    if ((pPVar10->opts).python_no_type_prefix_suffix == false) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,"  @classmethod\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,"  def GetRootAs",0xf);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,(char *)local_98._8_8_,(long)local_88);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"(cls, buf: bytes, offset: int) -> ",0x22);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(char *)local_98._8_8_,(long)local_88);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ...\n",6);
      pPVar10 = local_1a0->parser_;
    }
    if ((pPVar10->file_identifier_)._M_string_length == 0) goto LAB_0026f032;
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,"  @classmethod\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,"  def ",6);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar21,(char *)local_98._8_8_,(long)local_88);
    lVar20 = 0x54;
    pcVar22 = 
    "BufferHasIdentifier(cls, buf: bytes, offset: int, size_prefixed: bool) -> bool: ...\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar22,lVar20);
LAB_0026f032:
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar21,"  def Init(self, buf: bytes, pos: int) -> None: ...\n",0x34);
  ppFVar27 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar4 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_198 = poVar21;
  local_100 = struct_def;
  if (ppFVar27 != ppFVar4) {
    do {
      pFVar5 = *ppFVar27;
      if (pFVar5->deprecated != false) goto LAB_0026f7e3;
      (*(local_130->super_Namer)._vptr_Namer[4])(&local_170,local_130,pFVar5);
      BVar3 = (pFVar5->value).type.base_type;
      if (BVar3 - BASE_TYPE_UTYPE < 0xc) {
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"  def ",6);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_198,local_170._M_dataplus._M_p,local_170._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21,"(self) -> ",10);
        (anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
                  (&local_1c0,(PythonStubGenerator *)local_1a0,&(pFVar5->value).type,local_128);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar21,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,
                          (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
        }
        poVar21 = local_198;
        lVar20 = 6;
        if (pFVar5->presence == kOptional) {
          std::__ostream_insert<char,std::char_traits<char>>(local_198," | None",7);
          pcVar22 = ": ...\n";
        }
        else {
          pcVar22 = ": ...\n";
        }
        goto LAB_0026f7bc;
      }
      switch(BVar3) {
      case BASE_TYPE_STRING:
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"  def ",6);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_198,local_170._M_dataplus._M_p,local_170._M_string_length);
        lVar20 = 0x1a;
        pcVar22 = "(self) -> str | None: ...\n";
        break;
      case BASE_TYPE_VECTOR:
      case BASE_TYPE_ARRAY:
        BVar3 = (pFVar5->value).type.element;
        if (BVar3 == BASE_TYPE_STRING) {
          std::__ostream_insert<char,std::char_traits<char>>(local_198,"  def ",6);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              (local_198,local_170._M_dataplus._M_p,local_170._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar21,"(self, i: int) -> str: ...\n",0x1b);
        }
        else if (BVar3 == BASE_TYPE_STRUCT) {
          ModuleFor<flatbuffers::StructDef>(&local_1c0,local_1a0,(pFVar5->value).type.struct_def);
          (*(local_130->super_Namer)._vptr_Namer[0xf])
                    ((string *)local_190,local_130,(pFVar5->value).type.struct_def);
          pIVar13 = Imports::Import(local_128,&local_1c0,(string *)local_190);
          if ((_Alloc_hider *)local_190._0_8_ != (_Alloc_hider *)(local_190 + 0x10)) {
            operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,
                            (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>(local_198,"  def ",6);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              (local_198,local_170._M_dataplus._M_p,local_170._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,"(self, i: int) -> ",0x12);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar21,(pIVar13->name)._M_dataplus._M_p,
                               (pIVar13->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21," | None: ...\n",0xd);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(local_198,"  def ",6);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              (local_198,local_170._M_dataplus._M_p,local_170._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,"(self, i: int) -> ",0x12);
          (anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
                    (&local_1c0,(PythonStubGenerator *)local_1a0,&(pFVar5->value).type,local_128);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar21,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,": ...\n",6);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,
                            (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
          }
          if ((local_1a0->parser_->opts).python_gen_numpy == true) {
            std::__ostream_insert<char,std::char_traits<char>>(local_198,"  def ",6);
            poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                (local_198,local_170._M_dataplus._M_p,local_170._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar21,"AsNumpy(self) -> np.ndarray: ...\n",0x21);
          }
          pSVar15 = GetNestedStruct(local_1a0,pFVar5);
          if (pSVar15 != (StructDef *)0x0) {
            ModuleFor<flatbuffers::StructDef>(&local_1c0,local_1a0,pSVar15);
            (*(local_130->super_Namer)._vptr_Namer[0xf])((string *)local_190,local_130,pSVar15);
            pIVar13 = Imports::Import(local_128,&local_1c0,(string *)local_190);
            if ((_Alloc_hider *)local_190._0_8_ != (_Alloc_hider *)(local_190 + 0x10)) {
              operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,
                              (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
            }
            std::__ostream_insert<char,std::char_traits<char>>(local_198,"  def ",6);
            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1c0,local_170._M_dataplus._M_p,
                       local_170._M_dataplus._M_p + local_170._M_string_length);
            std::__cxx11::string::append((char *)&local_1c0);
            poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                (local_198,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
            poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar21,(pIVar13->name)._M_dataplus._M_p,
                                 (pIVar13->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar21," | None: ...\n",0xd);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,
                              (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
            }
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"  def ",6);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_198,local_170._M_dataplus._M_p,local_170._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar21,"Length(self) -> int: ...\n",0x19);
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"  def ",6);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_198,local_170._M_dataplus._M_p,local_170._M_string_length);
        lVar20 = 0x1a;
        pcVar22 = "IsNone(self) -> bool: ...\n";
        break;
      case BASE_TYPE_STRUCT:
        ModuleFor<flatbuffers::StructDef>(&local_1c0,local_1a0,(pFVar5->value).type.struct_def);
        (*(local_130->super_Namer)._vptr_Namer[0xf])
                  ((string *)local_190,local_130,(pFVar5->value).type.struct_def);
        pIVar13 = Imports::Import(local_128,&local_1c0,(string *)local_190);
        if ((_Alloc_hider *)local_190._0_8_ != (_Alloc_hider *)(local_190 + 0x10)) {
          operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,
                          (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
        }
        if (local_100->fixed == true) {
          std::__ostream_insert<char,std::char_traits<char>>(local_198,"  def ",6);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              (local_198,local_170._M_dataplus._M_p,local_170._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,"(self, obj: ",0xc);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar21,(pIVar13->name)._M_dataplus._M_p,
                               (pIVar13->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,") -> ",5);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar21,(pIVar13->name)._M_dataplus._M_p,
                               (pIVar13->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,": ...\n",6);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(local_198,"  def ",6);
          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1c0,local_170._M_dataplus._M_p,
                     local_170._M_dataplus._M_p + local_170._M_string_length);
          std::__cxx11::string::append((char *)&local_1c0);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              (local_198,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar21,(pIVar13->name)._M_dataplus._M_p,
                               (pIVar13->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21," | None: ...\n",0xd);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,
                            (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
          }
        }
        goto switchD_0026f193_default;
      case BASE_TYPE_UNION:
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"flatbuffers","");
        local_190._0_8_ = local_190 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"table","");
        Imports::Import(local_128,&local_1c0,(string *)local_190);
        if ((_Alloc_hider *)local_190._0_8_ != (_Alloc_hider *)(local_190 + 0x10)) {
          operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,
                          (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"  def ",6);
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_198,local_170._M_dataplus._M_p,local_170._M_string_length);
        lVar20 = 0x22;
        pcVar22 = "(self) -> table.Table | None: ...\n";
        break;
      default:
        goto switchD_0026f193_default;
      }
LAB_0026f7bc:
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,pcVar22,lVar20);
switchD_0026f193_default:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,
                        CONCAT17(local_170.field_2._M_local_buf[7],
                                 CONCAT16(local_170.field_2._M_local_buf[6],
                                          CONCAT24(local_170.field_2._M_allocated_capacity._4_2_,
                                                   local_170.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
LAB_0026f7e3:
      ppFVar27 = ppFVar27 + 1;
    } while (ppFVar27 != ppFVar4);
  }
  pSVar15 = local_100;
  poVar21 = local_198;
  if ((local_1a0->parser_->opts).generate_object_based_api != false) {
    (*(local_130->super_Namer)._vptr_Namer[0x11])(&local_70,local_130,local_100);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,"class ",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,(char *)local_70,local_68);
    if ((local_1a0->version_).major != 3) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,"(object)",8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,":\n",2);
    ppFVar27 = (pSVar15->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_98._M_allocated_capacity =
         (size_type)
         (pSVar15->fields).vec.
         super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar27 != (pointer)local_98._M_allocated_capacity) {
      do {
        pFVar5 = *ppFVar27;
        if (pFVar5->deprecated == false) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,"  ",2);
          (*(local_130->super_Namer)._vptr_Namer[0x12])(&local_f8,local_130,pFVar5);
          BVar3 = (pFVar5->value).type.base_type;
          if (BVar3 - BASE_TYPE_UTYPE < 0xc) {
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_170,local_f8,(undefined1 *)(local_f0 + (long)local_f8));
            std::__cxx11::string::append((char *)&local_170);
            (anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
                      (&local_1c0,(PythonStubGenerator *)local_1a0,&(pFVar5->value).type,local_128);
            pEVar24 = (EnumDef *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              pEVar24 = (EnumDef *)
                        CONCAT17(local_170.field_2._M_local_buf[7],
                                 CONCAT16(local_170.field_2._M_local_buf[6],
                                          CONCAT24(local_170.field_2._M_allocated_capacity._4_2_,
                                                   local_170.field_2._M_allocated_capacity._0_4_)));
            }
            if (pEVar24 < (EnumDef *)(local_1c0._M_string_length + local_170._M_string_length)) {
              uVar23 = (EnumDef *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                uVar23 = local_1c0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar23 <
                  (EnumDef *)(local_1c0._M_string_length + local_170._M_string_length))
              goto LAB_0026fa6a;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_1c0,0,(char *)0x0,(ulong)local_170._M_dataplus._M_p
                                  );
            }
            else {
LAB_0026fa6a:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_170,(ulong)local_1c0._M_dataplus._M_p);
            }
            plVar14 = puVar11 + 2;
            if ((long *)*puVar11 == plVar14) {
              local_110 = *plVar14;
              uStack_108 = puVar11[3];
              local_120 = &local_110;
            }
            else {
              local_110 = *plVar14;
              local_120 = (long *)*puVar11;
            }
            local_118 = puVar11[1];
            *puVar11 = plVar14;
            puVar11[1] = 0;
            *(undefined1 *)plVar14 = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,
                              (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,
                              CONCAT17(local_170.field_2._M_local_buf[7],
                                       CONCAT16(local_170.field_2._M_local_buf[6],
                                                CONCAT24(local_170.field_2._M_allocated_capacity.
                                                         _4_2_,local_170.field_2.
                                                               _M_allocated_capacity._0_4_))) + 1);
            }
            if (pFVar5->presence == kOptional) {
              std::__cxx11::string::append((char *)&local_120);
            }
          }
          else {
            switch(BVar3) {
            case BASE_TYPE_STRING:
              local_120 = &local_110;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_120,local_f8,(undefined1 *)(local_f0 + (long)local_f8));
              std::__cxx11::string::append((char *)&local_120);
              break;
            case BASE_TYPE_VECTOR:
            case BASE_TYPE_ARRAY:
              local_170.field_2._M_allocated_capacity._4_2_ = 0x676e;
              local_170.field_2._M_allocated_capacity._0_4_ = 0x69707974;
              local_170._M_string_length = 6;
              local_170.field_2._M_local_buf[6] = '\0';
              local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
              Imports::Import(local_128,&local_170);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                operator_delete(local_170._M_dataplus._M_p,
                                CONCAT17(local_170.field_2._M_local_buf[7],
                                         CONCAT16(local_170.field_2._M_local_buf[6],
                                                  CONCAT24(local_170.field_2._M_allocated_capacity.
                                                           _4_2_,local_170.field_2.
                                                                 _M_allocated_capacity._0_4_))) + 1)
                ;
              }
              BVar3 = (pFVar5->value).type.element;
              if (BVar3 == BASE_TYPE_STRING) {
                local_120 = &local_110;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_120,local_f8,(undefined1 *)(local_f0 + (long)local_f8));
                std::__cxx11::string::append((char *)&local_120);
              }
              else {
                if (BVar3 == BASE_TYPE_STRUCT) {
                  ModuleFor<flatbuffers::StructDef>
                            (&local_1c0,local_1a0,(pFVar5->value).type.struct_def);
                  (*(local_130->super_Namer)._vptr_Namer[0x11])
                            ((string *)local_190,local_130,(pFVar5->value).type.struct_def);
                  pIVar13 = Imports::Import(local_128,&local_1c0,(string *)local_190);
                  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                  pcVar6 = (pIVar13->module)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_170,pcVar6,pcVar6 + (pIVar13->module)._M_string_length
                            );
                  local_150[0] = local_140;
                  pcVar6 = (pIVar13->name)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_150,pcVar6,pcVar6 + (pIVar13->name)._M_string_length);
                  if ((_Alloc_hider *)local_190._0_8_ != (_Alloc_hider *)(local_190 + 0x10)) {
                    operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                    operator_delete(local_1c0._M_dataplus._M_p,
                                    (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
                  }
                  local_190._0_8_ = local_190 + 0x10;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_190,local_f8,(undefined1 *)(local_f0 + (long)local_f8))
                  ;
                  std::__cxx11::string::append((char *)local_190);
                  puVar11 = (undefined8 *)
                            std::__cxx11::string::_M_append((char *)local_190,(ulong)local_150[0]);
                  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                  puVar16 = puVar11 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar11 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar16) {
                    local_1c0.field_2._M_allocated_capacity = *puVar16;
                    local_1c0.field_2._8_8_ = puVar11[3];
                  }
                  else {
                    local_1c0.field_2._M_allocated_capacity = *puVar16;
                    local_1c0._M_dataplus._M_p = (pointer)*puVar11;
                  }
                  local_1c0._M_string_length = puVar11[1];
                  *puVar11 = puVar16;
                  puVar11[1] = 0;
                  *(undefined1 *)(puVar11 + 2) = 0;
                  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c0);
                  goto LAB_00270427;
                }
                local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1c0,local_f8,(undefined1 *)(local_f0 + (long)local_f8));
                std::__cxx11::string::append((char *)&local_1c0);
                local_c8._8_2_ = (pFVar5->value).type.fixed_length;
                local_d8._4_4_ = 0;
                local_d8._0_4_ = (pFVar5->value).type.element;
                local_d8._8_8_ = (pFVar5->value).type.struct_def;
                local_c8._0_8_ = (pFVar5->value).type.enum_def;
                (anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
                          ((string *)local_190,(PythonStubGenerator *)local_1a0,(Type *)local_d8,
                           local_128);
                uVar23 = (EnumDef *)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                  uVar23 = local_1c0.field_2._M_allocated_capacity;
                }
                pEVar24 = (EnumDef *)
                          ((long)&(((Definition *)local_190._8_8_)->name)._M_dataplus._M_p +
                          local_1c0._M_string_length);
                if ((ulong)uVar23 < pEVar24) {
                  pEVar25 = (EnumDef *)0xf;
                  if ((_Alloc_hider *)local_190._0_8_ != (_Alloc_hider *)(local_190 + 0x10)) {
                    pEVar25 = (EnumDef *)local_190._16_8_;
                  }
                  if (pEVar25 < pEVar24) goto LAB_002702b1;
                  puVar11 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)local_190,0,(char *)0x0,
                                       (ulong)local_1c0._M_dataplus._M_p);
                }
                else {
LAB_002702b1:
                  puVar11 = (undefined8 *)
                            std::__cxx11::string::_M_append((char *)&local_1c0,local_190._0_8_);
                }
                local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                puVar16 = puVar11 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar16) {
                  uVar23 = *puVar16;
                  uVar26 = puVar11[3];
                  local_170.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar23;
                  local_170.field_2._M_allocated_capacity._4_2_ =
                       (undefined2)((ulong)uVar23 >> 0x20);
                  local_170.field_2._M_local_buf[6] = (char)((ulong)uVar23 >> 0x30);
                  local_170.field_2._M_local_buf[7] = (char)((ulong)uVar23 >> 0x38);
                  local_170.field_2._8_3_ = (undefined3)uVar26;
                  local_170.field_2._M_local_buf[0xb] = (char)((ulong)uVar26 >> 0x18);
                  local_170.field_2._12_4_ = (undefined4)((ulong)uVar26 >> 0x20);
                }
                else {
                  uVar23 = *puVar16;
                  local_170.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar23;
                  local_170.field_2._M_allocated_capacity._4_2_ =
                       (undefined2)((ulong)uVar23 >> 0x20);
                  local_170.field_2._M_local_buf[6] = (char)((ulong)uVar23 >> 0x30);
                  local_170.field_2._M_local_buf[7] = (char)((ulong)uVar23 >> 0x38);
                  local_170._M_dataplus._M_p = (pointer)*puVar11;
                }
                local_170._M_string_length = puVar11[1];
                *puVar11 = puVar16;
                puVar11[1] = 0;
                *(undefined1 *)puVar16 = 0;
                puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
                plVar14 = puVar11 + 2;
                if ((long *)*puVar11 == plVar14) {
                  local_110 = *plVar14;
                  uStack_108 = puVar11[3];
                  local_120 = &local_110;
                }
                else {
                  local_110 = *plVar14;
                  local_120 = (long *)*puVar11;
                }
                local_118 = puVar11[1];
                *puVar11 = plVar14;
                puVar11[1] = 0;
                *(undefined1 *)(puVar11 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170._M_dataplus._M_p != &local_170.field_2) {
                  operator_delete(local_170._M_dataplus._M_p,
                                  CONCAT17(local_170.field_2._M_local_buf[7],
                                           CONCAT16(local_170.field_2._M_local_buf[6],
                                                    CONCAT24(local_170.field_2._M_allocated_capacity
                                                             ._4_2_,local_170.field_2.
                                                                    _M_allocated_capacity._0_4_))) +
                                  1);
                }
                if ((_Alloc_hider *)local_190._0_8_ != (_Alloc_hider *)(local_190 + 0x10)) {
                  operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
                }
                uVar23 = local_1c0.field_2._M_allocated_capacity;
                uVar26 = local_1c0._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) goto LAB_00270692;
              }
              break;
            case BASE_TYPE_STRUCT:
              ModuleFor<flatbuffers::StructDef>
                        (&local_1c0,local_1a0,(pFVar5->value).type.struct_def);
              (*(local_130->super_Namer)._vptr_Namer[0x11])
                        ((string *)local_190,local_130,(pFVar5->value).type.struct_def);
              pIVar13 = Imports::Import(local_128,&local_1c0,(string *)local_190);
              local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
              pcVar6 = (pIVar13->module)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_170,pcVar6,pcVar6 + (pIVar13->module)._M_string_length);
              local_150[0] = local_140;
              pcVar6 = (pIVar13->name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_150,pcVar6,pcVar6 + (pIVar13->name)._M_string_length);
              if ((_Alloc_hider *)local_190._0_8_ != (_Alloc_hider *)(local_190 + 0x10)) {
                operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
              }
              local_190._0_8_ = local_190 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_190,local_f8,(undefined1 *)(local_f0 + (long)local_f8));
              std::__cxx11::string::append((char *)local_190);
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)local_190,(ulong)local_150[0]);
              local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
              puVar16 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar16) {
                local_1c0.field_2._M_allocated_capacity = *puVar16;
                local_1c0.field_2._8_8_ = puVar11[3];
              }
              else {
                local_1c0.field_2._M_allocated_capacity = *puVar16;
                local_1c0._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_1c0._M_string_length = puVar11[1];
              *puVar11 = puVar16;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c0);
LAB_00270427:
              local_120 = &local_110;
              plVar14 = puVar11 + 2;
              if ((long *)*puVar11 == plVar14) {
                local_110 = *plVar14;
                uStack_108 = puVar11[3];
              }
              else {
                local_110 = *plVar14;
                local_120 = (long *)*puVar11;
              }
              local_118 = puVar11[1];
              *puVar11 = plVar14;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
              }
              if ((_Alloc_hider *)local_190._0_8_ != (_Alloc_hider *)(local_190 + 0x10)) {
                operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
              }
              if (local_150[0] != local_140) {
                operator_delete(local_150[0],local_140[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                uVar23 = (EnumDef *)
                         CONCAT17(local_170.field_2._M_local_buf[7],
                                  CONCAT16(local_170.field_2._M_local_buf[6],
                                           CONCAT24(local_170.field_2._M_allocated_capacity._4_2_,
                                                    local_170.field_2._M_allocated_capacity._0_4_)))
                ;
                uVar26 = local_170._M_dataplus._M_p;
LAB_00270692:
                operator_delete((void *)uVar26,
                                (ulong)((long)&(((EnumDef *)uVar23)->super_Definition).name.
                                               _M_dataplus._M_p + 1));
              }
              break;
            case BASE_TYPE_UNION:
              local_b8._M_allocated_capacity = (size_type)(local_c8 + 0x20);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_c8 + 0x10),local_f8,
                         (undefined1 *)(local_f0 + (long)local_f8));
              std::__cxx11::string::append((char *)(local_c8 + 0x10));
              pEVar24 = (pFVar5->value).type.enum_def;
              local_170.field_2._M_allocated_capacity._4_2_ = 0x676e;
              local_170.field_2._M_allocated_capacity._0_4_ = 0x69707974;
              local_170._M_string_length = 6;
              local_170.field_2._M_local_buf[6] = '\0';
              local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
              Imports::Import(local_128,&local_170);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                operator_delete(local_170._M_dataplus._M_p,
                                CONCAT17(local_170.field_2._M_local_buf[7],
                                         CONCAT16(local_170.field_2._M_local_buf[6],
                                                  CONCAT24(local_170.field_2._M_allocated_capacity.
                                                           _4_2_,local_170.field_2.
                                                                 _M_allocated_capacity._0_4_))) + 1)
                ;
              }
              local_1c0._M_string_length = 0;
              local_1c0.field_2._M_allocated_capacity =
                   local_1c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
              ppEVar7 = (pEVar24->vals).vec.
                        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
              for (ppEVar28 = (pEVar24->vals).vec.
                              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                              ._M_impl.super__Vector_impl_data._M_start; ppEVar28 != ppEVar7;
                  ppEVar28 = ppEVar28 + 1) {
                pEVar8 = *ppEVar28;
                if (local_1c0._M_string_length != 0) {
                  std::__cxx11::string::append((char *)&local_1c0);
                }
                BVar3 = (pEVar8->union_type).base_type;
                if ((BVar3 == BASE_TYPE_NONE) || (BVar3 == BASE_TYPE_STRING)) {
                  std::__cxx11::string::append((char *)&local_1c0);
                }
                else if (BVar3 == BASE_TYPE_STRUCT) {
                  ModuleFor<flatbuffers::StructDef>
                            ((string *)local_190,local_1a0,(pEVar8->union_type).struct_def);
                  (*(local_130->super_Namer)._vptr_Namer[0x11])
                            ((string *)local_d8,local_130,(pEVar8->union_type).struct_def);
                  pIVar13 = Imports::Import(local_128,(string *)local_190,(string *)local_d8);
                  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                  pcVar6 = (pIVar13->module)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_170,pcVar6,pcVar6 + (pIVar13->module)._M_string_length
                            );
                  local_150[0] = local_140;
                  pcVar6 = (pIVar13->name)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_150,pcVar6,pcVar6 + (pIVar13->name)._M_string_length);
                  if ((StructDef *)local_d8._0_8_ != (StructDef *)local_c8) {
                    operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._0_8_ + 1));
                  }
                  if ((_Alloc_hider *)local_190._0_8_ != (_Alloc_hider *)(local_190 + 0x10)) {
                    operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
                  }
                  std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_150[0]);
                  if (local_150[0] != local_140) {
                    operator_delete(local_150[0],local_140[0] + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_170._M_dataplus._M_p != &local_170.field_2) {
                    operator_delete(local_170._M_dataplus._M_p,
                                    CONCAT17(local_170.field_2._M_local_buf[7],
                                             CONCAT16(local_170.field_2._M_local_buf[6],
                                                      CONCAT24(local_170.field_2.
                                                               _M_allocated_capacity._4_2_,
                                                               local_170.field_2.
                                                               _M_allocated_capacity._0_4_))) + 1);
                  }
                }
              }
              std::operator+(&local_170,"typing.Union[",&local_1c0);
              plVar14 = (long *)std::__cxx11::string::append((char *)&local_170);
              p_Var17 = (_Base_ptr)(plVar14 + 2);
              if ((_Base_ptr)*plVar14 == p_Var17) {
                local_40 = *(EnumDef **)p_Var17;
                p_Stack_38 = (_Base_ptr)plVar14[3];
                local_50 = (_Base_ptr)&local_40;
              }
              else {
                local_40 = *(EnumDef **)p_Var17;
                local_50 = (_Base_ptr)*plVar14;
              }
              local_48 = plVar14[1];
              *plVar14 = (long)p_Var17;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                operator_delete(local_170._M_dataplus._M_p,
                                CONCAT17(local_170.field_2._M_local_buf[7],
                                         CONCAT16(local_170.field_2._M_local_buf[6],
                                                  CONCAT24(local_170.field_2._M_allocated_capacity.
                                                           _4_2_,local_170.field_2.
                                                                 _M_allocated_capacity._0_4_))) + 1)
                ;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
              }
              uVar23 = (EnumDef *)0xf;
              if ((undefined1 *)local_b8._M_allocated_capacity != local_c8 + 0x20) {
                uVar23 = local_a8._M_allocated_capacity;
              }
              if ((ulong)uVar23 < (EnumDef *)(local_48 + local_b8._8_8_)) {
                pEVar24 = (EnumDef *)0xf;
                if (local_50 != (_Base_ptr)&local_40) {
                  pEVar24 = local_40;
                }
                if (pEVar24 < (EnumDef *)(local_48 + local_b8._8_8_)) goto LAB_002703e6;
                puVar11 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_50,0,(char *)0x0,local_b8._M_allocated_capacity);
              }
              else {
LAB_002703e6:
                puVar11 = (undefined8 *)
                          std::__cxx11::string::_M_append(local_c8 + 0x10,(ulong)local_50);
              }
              plVar14 = puVar11 + 2;
              if ((long *)*puVar11 == plVar14) {
                local_110 = *plVar14;
                uStack_108 = puVar11[3];
                local_120 = &local_110;
              }
              else {
                local_110 = *plVar14;
                local_120 = (long *)*puVar11;
              }
              local_118 = puVar11[1];
              *puVar11 = plVar14;
              puVar11[1] = 0;
              *(undefined1 *)plVar14 = 0;
              if (local_50 != (_Base_ptr)&local_40) {
                operator_delete(local_50,(ulong)((long)&(local_40->super_Definition).name.
                                                        _M_dataplus._M_p + 1));
              }
              uVar23 = local_a8._M_allocated_capacity;
              uVar26 = local_b8._M_allocated_capacity;
              if ((undefined1 *)local_b8._M_allocated_capacity != local_c8 + 0x20)
              goto LAB_00270692;
              break;
            default:
              if (local_f8 == (long *)&local_e8) {
                uStack_108 = uStack_e0;
                local_120 = &local_110;
              }
              else {
                local_120 = local_f8;
              }
              local_110 = CONCAT71(uStack_e7,local_e8);
              local_118 = local_f0;
              local_f0 = 0;
              local_e8 = 0;
              local_f8 = (long *)&local_e8;
            }
          }
          if (local_f8 != (long *)&local_e8) {
            operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
          }
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar21,(char *)local_120,local_118);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          if (local_120 != &local_110) {
            operator_delete(local_120,local_110 + 1);
          }
        }
        ppFVar27 = ppFVar27 + 1;
      } while (ppFVar27 != (pointer)local_98._M_allocated_capacity);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,"  @classmethod\n",0xf);
    pSVar15 = local_100;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar21,"  def InitFromBuf(cls, buf: bytes, pos: int) -> ",0x30);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar21,(char *)local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ...\n",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,"  @classmethod\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar21,"  def InitFromPackedBuf(cls, buf: bytes, pos: int = 0) -> ",0x3a);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar21,(char *)local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ...\n",6);
    ModuleFor<flatbuffers::StructDef>(&local_170,local_1a0,pSVar15);
    (*(local_130->super_Namer)._vptr_Namer[0xf])(&local_1c0,local_130,pSVar15);
    pIVar13 = Imports::Import(local_128,&local_170,&local_1c0);
    paVar1 = &local_1c0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c0._M_dataplus._M_p,
                      (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
    }
    paVar2 = &local_170.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar2) {
      operator_delete(local_170._M_dataplus._M_p,
                      CONCAT17(local_170.field_2._M_local_buf[7],
                               CONCAT16(local_170.field_2._M_local_buf[6],
                                        CONCAT24(local_170.field_2._M_allocated_capacity._4_2_,
                                                 local_170.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,"  @classmethod\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,"  def InitFromObj(cls, ",0x17);
    (*(local_130->super_Namer)._vptr_Namer[7])(&local_170,local_130,local_100);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar21,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                   ": ",&pIVar13->name);
    plVar14 = (long *)std::__cxx11::string::append((char *)local_190);
    plVar18 = plVar14 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar18) {
      local_1c0.field_2._M_allocated_capacity = *plVar18;
      local_1c0.field_2._8_8_ = plVar14[3];
      local_1c0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1c0.field_2._M_allocated_capacity = *plVar18;
      local_1c0._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_1c0._M_string_length = plVar14[1];
    *plVar14 = (long)plVar18;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ...\n",6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c0._M_dataplus._M_p,
                      (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
    }
    if ((_Alloc_hider *)local_190._0_8_ != (_Alloc_hider *)(local_190 + 0x10)) {
      operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar2) {
      operator_delete(local_170._M_dataplus._M_p,
                      CONCAT17(local_170.field_2._M_local_buf[7],
                               CONCAT16(local_170.field_2._M_local_buf[6],
                                        CONCAT24(local_170.field_2._M_allocated_capacity._4_2_,
                                                 local_170.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,"  def _UnPack(self, ",0x14);
    (*(local_130->super_Namer)._vptr_Namer[7])(&local_170,local_130,local_100);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar21,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ",2);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,(pIVar13->name)._M_dataplus._M_p,(pIVar13->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") -> None: ...\n",0xf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar2) {
      operator_delete(local_170._M_dataplus._M_p,
                      CONCAT17(local_170.field_2._M_local_buf[7],
                               CONCAT16(local_170.field_2._M_local_buf[6],
                                        CONCAT24(local_170.field_2._M_allocated_capacity._4_2_,
                                                 local_170.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar21,"  def Pack(self, builder: flatbuffers.Builder) -> None: ...\n",0x3c);
    if ((local_1a0->parser_->opts).gen_compare == true) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,"  def __eq__(self, other: ",0x1a);
      local_170._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,local_70,(long)local_70 + local_68);
      std::__cxx11::string::append((char *)&local_170);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar21,local_170._M_dataplus._M_p,local_170._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != paVar2) {
        operator_delete(local_170._M_dataplus._M_p,
                        CONCAT17(local_170.field_2._M_local_buf[7],
                                 CONCAT16(local_170.field_2._M_local_buf[6],
                                          CONCAT24(local_170.field_2._M_allocated_capacity._4_2_,
                                                   local_170.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
    }
    pSVar15 = local_100;
    if (local_70 != local_60) {
      operator_delete(local_70,(ulong)((long)&local_60[0]->_M_color + 1));
    }
  }
  if (pSVar15->fixed == true) {
    paVar1 = &local_170.field_2;
    local_170.field_2._M_allocated_capacity._0_4_ = 0x74616c66;
    local_170.field_2._M_allocated_capacity._4_2_ = 0x7562;
    local_170.field_2._M_local_buf[6] = 'f';
    local_170.field_2._7_4_ = 0x73726566;
    local_170._M_string_length = 0xb;
    local_170.field_2._M_local_buf[0xb] = '\0';
    local_170._M_dataplus._M_p = (pointer)paVar1;
    Imports::Import(local_128,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,
                      CONCAT17(local_170.field_2._M_local_buf[7],
                               CONCAT16(local_170.field_2._M_local_buf[6],
                                        CONCAT24(local_170.field_2._M_allocated_capacity._4_2_,
                                                 local_170.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_c8._0_8_ = (EnumDef *)0x0;
    local_d8._0_8_ = (StructDef *)0x0;
    local_d8._8_8_ = (StructDef *)0x0;
    local_170._M_string_length = 0;
    local_170.field_2._M_allocated_capacity._0_4_ =
         local_170.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    local_170._M_dataplus._M_p = (pointer)paVar1;
    StructBuilderArgs(local_1a0,pSVar15,&local_170,local_128,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p,
                      CONCAT17(local_170.field_2._M_local_buf[7],
                               CONCAT16(local_170.field_2._M_local_buf[6],
                                        CONCAT24(local_170.field_2._M_allocated_capacity._4_2_,
                                                 local_170.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_1c0._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,(char *)&local_1c0,1);
    (*(local_130->super_Namer)._vptr_Namer[0xf])((_Alloc_hider *)local_190,local_130,pSVar15);
    plVar14 = (long *)std::__cxx11::string::replace((ulong)local_190,0,(char *)0x0,0x370fc5);
    plVar18 = plVar14 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar18) {
      local_1c0.field_2._M_allocated_capacity = *plVar18;
      local_1c0.field_2._8_8_ = plVar14[3];
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    }
    else {
      local_1c0.field_2._M_allocated_capacity = *plVar18;
      local_1c0._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_1c0._M_string_length = plVar14[1];
    *plVar14 = (long)plVar18;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar21,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(builder: flatbuffers.Builder",0x1d)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,
                      (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
    }
    pSVar15 = (StructDef *)local_d8._0_8_;
    pSVar9 = (StructDef *)local_d8._8_8_;
    if ((_Alloc_hider *)local_190._0_8_ != (_Alloc_hider *)(local_190 + 0x10)) {
      operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
      pSVar15 = (StructDef *)local_d8._0_8_;
      pSVar9 = (StructDef *)local_d8._8_8_;
    }
    for (; uVar23 = local_d8._8_8_, pSVar15 != (StructDef *)local_d8._8_8_;
        pSVar15 = (StructDef *)&(pSVar15->super_Definition).file) {
      local_d8._8_8_ = pSVar9;
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar21,(pSVar15->super_Definition).name._M_dataplus._M_p,
                 (pSVar15->super_Definition).name._M_string_length);
      pSVar9 = (StructDef *)local_d8._8_8_;
      local_d8._8_8_ = uVar23;
    }
    local_d8._8_8_ = pSVar9;
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,") -> uoffset: ...\n",0x12);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d8);
  }
  else {
    (*(local_130->super_Namer)._vptr_Namer[0xf])(&local_170,local_130,pSVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,"def ",4);
    if ((local_1a0->parser_->opts).python_no_type_prefix_suffix == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar21,local_170._M_dataplus._M_p,local_170._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar21,"Start(builder: flatbuffers.Builder) -> None: ...\n",0x31);
    if (((local_1a0->parser_->opts).one_file == false) &&
       ((local_1a0->parser_->opts).python_no_type_prefix_suffix == false)) {
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar21,"def Start(builder: flatbuffers.Builder) -> None: ...\n",0x35);
    }
    ppFVar27 = (pSVar15->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_98._M_allocated_capacity =
         (size_type)
         (pSVar15->fields).vec.
         super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar27 != (pointer)local_98._M_allocated_capacity) {
      do {
        pFVar5 = *ppFVar27;
        if (pFVar5->deprecated == false) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,"def ",4);
          if ((local_1a0->parser_->opts).python_no_type_prefix_suffix == false) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar21,local_170._M_dataplus._M_p,local_170._M_string_length);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,"Add",3);
          (*(local_130->super_Namer)._vptr_Namer[4])(&local_1c0,local_130,pFVar5);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar21,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"(builder: flatbuffers.Builder, ",0x1f);
          (*(local_130->super_Namer)._vptr_Namer[7])(local_d8,local_130,pFVar5);
          puVar11 = (undefined8 *)std::__cxx11::string::append(local_d8);
          p_Var19 = (_Alloc_hider *)(puVar11 + 2);
          if ((_Alloc_hider *)*puVar11 == p_Var19) {
            local_190._16_8_ = p_Var19->_M_p;
            _local_178 = puVar11[3];
            local_190._0_8_ = (_Alloc_hider *)(local_190 + 0x10);
          }
          else {
            local_190._16_8_ = p_Var19->_M_p;
            local_190._0_8_ = (_Alloc_hider *)*puVar11;
          }
          local_190._8_8_ = puVar11[1];
          *puVar11 = p_Var19;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,(char *)local_190._0_8_,local_190._8_8_);
          if ((_Alloc_hider *)local_190._0_8_ != (_Alloc_hider *)(local_190 + 0x10)) {
            operator_delete((void *)local_190._0_8_,(ulong)(local_190._16_8_ + 1));
          }
          if ((StructDef *)local_d8._0_8_ != (StructDef *)local_c8) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,
                            (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
          }
          BVar3 = (pFVar5->value).type.base_type;
          if (BVar3 - BASE_TYPE_UTYPE < 0xc) {
            (anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
                      (&local_1c0,(PythonStubGenerator *)local_1a0,&(pFVar5->value).type,local_128);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar21,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
LAB_00270ecf:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,
                              (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
            }
          }
          else {
            if (BVar3 == BASE_TYPE_ARRAY) {
              local_190._4_4_ = 0;
              local_190._0_4_ = (pFVar5->value).type.element;
              local_190._8_8_ = (pFVar5->value).type.struct_def;
              local_190._16_8_ = (pFVar5->value).type.enum_def;
              local_178 = (pFVar5->value).type.fixed_length;
              (anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
                        (&local_1c0,(PythonStubGenerator *)local_1a0,(Type *)local_190,local_128);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar21,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
              goto LAB_00270ecf;
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,"uoffset",7);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,") -> None: ...\n",0xf);
          BVar3 = (pFVar5->value).type.base_type;
          if ((BVar3 == BASE_TYPE_VECTOR64) || (BVar3 == BASE_TYPE_VECTOR)) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,"def ",4);
            if ((local_1a0->parser_->opts).python_no_type_prefix_suffix == false) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar21,local_170._M_dataplus._M_p,local_170._M_string_length);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar21,"Start",5);
            (*(local_130->super_Namer)._vptr_Namer[4])(&local_1c0,local_130,pFVar5);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar21,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       "Vector(builder: flatbuffers.Builder, num_elems: int) -> uoffset: ...\n",0x45
                      );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,
                              (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
            }
            if (((local_1a0->parser_->opts).one_file == false) &&
               ((local_1a0->parser_->opts).python_no_type_prefix_suffix == false)) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,"def Start",9);
              (*(local_130->super_Namer)._vptr_Namer[4])(&local_1c0,local_130,pFVar5);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar21,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,
                         "Vector(builder: flatbuffers.Builder, num_elems: int) -> uoffset: ...\n",
                         0x45);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
              }
            }
            pSVar15 = GetNestedStruct(local_1a0,pFVar5);
            if (pSVar15 != (StructDef *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar21,"def ",4);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar21,local_170._M_dataplus._M_p,local_170._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Make",4);
              (*(local_130->super_Namer)._vptr_Namer[4])(&local_1c0,local_130,pFVar5);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,
                         "VectorFromBytes(builder: flatbuffers.Builder, buf: bytes) -> uoffset: ...\n"
                         ,0x4a);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
              }
              if ((local_1a0->parser_->opts).one_file == false) {
                std::__ostream_insert<char,std::char_traits<char>>(poVar21,"def Make",8);
                (*(local_130->super_Namer)._vptr_Namer[4])(&local_1c0,local_130,pFVar5);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar21,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,
                           "VectorFromBytes(builder: flatbuffers.Builder, buf: bytes) -> uoffset: ...\n"
                           ,0x4a);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                  operator_delete(local_1c0._M_dataplus._M_p,
                                  (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
                }
              }
            }
          }
        }
        ppFVar27 = ppFVar27 + 1;
      } while (ppFVar27 != (pointer)local_98._M_allocated_capacity);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,"def ",4);
    if ((local_1a0->parser_->opts).python_no_type_prefix_suffix == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar21,local_170._M_dataplus._M_p,local_170._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar21,"End(builder: flatbuffers.Builder) -> uoffset: ...\n",0x32);
    if (((local_1a0->parser_->opts).one_file == false) &&
       ((local_1a0->parser_->opts).python_no_type_prefix_suffix == false)) {
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar21,"def End(builder: flatbuffers.Builder) -> uoffset: ...\n",0x36);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,
                      CONCAT17(local_170.field_2._M_local_buf[7],
                               CONCAT16(local_170.field_2._M_local_buf[6],
                                        CONCAT24(local_170.field_2._M_allocated_capacity._4_2_,
                                                 local_170.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
  }
  if ((pointer *)local_98._8_8_ != local_80) {
    operator_delete((void *)local_98._8_8_,(ulong)((long)&(local_80[0]->_M_dataplus)._M_p + 1));
  }
  return;
}

Assistant:

void GenerateStructStub(std::stringstream &stub, const StructDef *struct_def,
                          Imports *imports) const {
    std::string type = namer_.Type(*struct_def);

    stub << "class " << type;
    if (version_.major != 3) stub << "(object)";
    stub << ":\n";
    if (struct_def->fixed) {
      stub << "  @classmethod\n";
      stub << "  def SizeOf(cls) -> int: ...\n\n";
    } else {
      stub << "  @classmethod\n";
      stub << "  def GetRootAs(cls, buf: bytes, offset: int) -> " << type
           << ": ...\n";

      if (!parser_.opts.python_no_type_prefix_suffix) {
        stub << "  @classmethod\n";
        stub << "  def GetRootAs" << type
             << "(cls, buf: bytes, offset: int) -> " << type << ": ...\n";
      }
      if (parser_.file_identifier_.length()) {
        stub << "  @classmethod\n";
        stub << "  def " << type
             << "BufferHasIdentifier(cls, buf: bytes, offset: int, "
                "size_prefixed: bool) -> bool: ...\n";
      }
    }

    stub << "  def Init(self, buf: bytes, pos: int) -> None: ...\n";

    for (const FieldDef *field : struct_def->fields.vec) {
      if (field->deprecated) continue;

      std::string name = namer_.Method(*field);

      const Type &field_type = field->value.type;
      if (IsScalar(field_type.base_type)) {
        stub << "  def " << name << "(self) -> " << TypeOf(field_type, imports);
        if (field->IsOptional()) stub << " | None";
        stub << ": ...\n";
      } else {
        switch (field_type.base_type) {
          case BASE_TYPE_STRUCT: {
            const Import &import =
                imports->Import(ModuleFor(field_type.struct_def),
                                namer_.Type(*field_type.struct_def));
            if (struct_def->fixed) {
              stub << "  def " << name << "(self, obj: " << import.name
                   << ") -> " << import.name << ": ...\n";
            } else {
              stub << "  def " << name + "(self) -> " << import.name
                   << " | None: ...\n";
            }
            break;
          }
          case BASE_TYPE_STRING:
            stub << "  def " << name << "(self) -> str | None: ...\n";
            break;
          case BASE_TYPE_ARRAY:
          case BASE_TYPE_VECTOR: {
            switch (field_type.element) {
              case BASE_TYPE_STRUCT: {
                const Import &import =
                    imports->Import(ModuleFor(field_type.struct_def),
                                    namer_.Type(*field_type.struct_def));
                stub << "  def " << name << "(self, i: int) -> " << import.name
                     << " | None: ...\n";
                break;
              }
              case BASE_TYPE_STRING:
                stub << "  def " << name << "(self, i: int) -> str: ...\n";
                break;
              default:  // scalars
                stub << "  def " << name << "(self, i: int) -> "
                     << TypeOf(field_type, imports) << ": ...\n";

                if (parser_.opts.python_gen_numpy) {
                  stub << "  def " << name
                       << "AsNumpy(self) -> np.ndarray: ...\n";
                }

                const StructDef *nested_def = GetNestedStruct(field);
                if (nested_def != nullptr) {
                  const Import &import = imports->Import(
                      ModuleFor(nested_def), namer_.Type(*nested_def));

                  stub << "  def " << name + "NestedRoot(self) -> "
                       << import.name << " | None: ...\n";
                }
                break;
            }
            stub << "  def " << name << "Length(self) -> int: ...\n";
            stub << "  def " << name << "IsNone(self) -> bool: ...\n";
            break;
          }
          case BASE_TYPE_UNION: {
            imports->Import("flatbuffers", "table");
            stub << "  def " << name << "(self) -> table.Table | None: ...\n";
            break;
          }
          default:
            break;
        }
      }
    }

    if (parser_.opts.generate_object_based_api) {
      GenerateObjectStub(stub, struct_def, imports);
    }

    if (struct_def->fixed) {
      GenerateStructBuilderStub(stub, struct_def, imports);
    } else {
      GenerateTableBuilderStub(stub, struct_def, imports);
    }
  }